

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O1

bool __thiscall xercesc_4_0::DTDScanner::scanCharRef(DTDScanner *this,XMLCh *first,XMLCh *second)

{
  bool bVar1;
  XMLCh XVar2;
  UnexpectedEOFException *this_00;
  int iVar3;
  uint uVar4;
  Codes toEmit;
  XMLScanner *this_01;
  uint uVar5;
  XMLCh tmpStr [2];
  XMLCh local_3c [2];
  XMLCh *local_38;
  
  local_38 = second;
  bVar1 = ReaderMgr::skippedChar(this->fReaderMgr,L'x');
  uVar4 = 0x10;
  if (!bVar1) {
    bVar1 = ReaderMgr::skippedChar(this->fReaderMgr,L'X');
    uVar4 = 10;
    if (bVar1) {
      XMLScanner::emitError(this->fScanner,HexRadixMustBeLowerCase);
      uVar4 = 0x10;
    }
  }
  uVar5 = 0;
  bVar1 = false;
  do {
    XVar2 = ReaderMgr::peekNextChar(this->fReaderMgr);
    if (XVar2 == L'\0') {
      this_00 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
      UnexpectedEOFException::UnexpectedEOFException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/DTD/DTDScanner.cpp"
                 ,0x3bc,Gen_UnexpectedEOF,this->fMemoryManager);
      __cxa_throw(this_00,&UnexpectedEOFException::typeinfo,XMLException::~XMLException);
    }
    if (XVar2 == L';') {
      ReaderMgr::getNextChar(this->fReaderMgr);
      iVar3 = 3;
    }
    else {
      iVar3 = -0x30;
      if ((((ushort)(XVar2 + L'￐') < 10) || (iVar3 = -0x37, (ushort)(XVar2 + L'﾿') < 6)) ||
         (iVar3 = -0x57, (ushort)(XVar2 + L'ﾟ') < 6)) {
        if ((uint)(ushort)XVar2 + iVar3 < uVar4) {
          uVar5 = uVar5 * uVar4 + (uint)(ushort)XVar2 + iVar3;
        }
        else {
          local_3c[1] = 0;
          local_3c[0] = XVar2;
          XMLScanner::emitError
                    (this->fScanner,BadDigitForRadix,local_3c,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0
                    );
        }
        ReaderMgr::getNextChar(this->fReaderMgr);
        iVar3 = 0;
        bVar1 = true;
      }
      else {
        if (bVar1) {
          this_01 = this->fScanner;
          toEmit = UnterminatedCharRef;
        }
        else {
          this_01 = this->fScanner;
          toEmit = ExpectedNumericalCharRef;
        }
        XMLScanner::emitError(this_01,toEmit);
        iVar3 = 1;
      }
    }
  } while (iVar3 == 0);
  if (iVar3 == 3) {
    if (uVar5 - 0x10000 < 0x100000) {
      *first = (ushort)(uVar5 - 0x10000 >> 10) | 0xd800;
      *local_38 = (XMLCh)uVar5 & 0x3ffU | 0xdc00;
      return true;
    }
    if (uVar5 < 0xfffe) {
      *first = (XMLCh)uVar5;
      *local_38 = L'\0';
      if ((this->fReaderMgr->fCurReader->fgCharCharsTable[(ushort)*first] & 0x60) != 0) {
        return true;
      }
    }
    XMLScanner::emitError(this->fScanner,InvalidCharacterRef);
  }
  return false;
}

Assistant:

bool DTDScanner::scanCharRef(XMLCh& first, XMLCh& second)
{
    bool gotOne = false;
    unsigned int value = 0;

    //
    //  Set the radix. Its supposed to be a lower case x if hex. But, in
    //  order to recover well, we check for an upper and put out an error
    //  for that.
    //
    unsigned int radix = 10;

    if (fReaderMgr->skippedChar(chLatin_x))
    {
        radix = 16;
    }
     else if (fReaderMgr->skippedChar(chLatin_X))
    {
        fScanner->emitError(XMLErrs::HexRadixMustBeLowerCase);
        radix = 16;
    }

    while (true)
    {
        const XMLCh nextCh = fReaderMgr->peekNextChar();

        // Watch for EOF
        if (!nextCh)
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);

        // Break out on the terminating semicolon
        if (nextCh == chSemiColon)
        {
            fReaderMgr->getNextChar();
            break;
        }

        //
        //  Convert this char to a binary value, or bail out if its not
        //  one.
        //
        unsigned int nextVal;
        if ((nextCh >= chDigit_0) && (nextCh <= chDigit_9))
            nextVal = (unsigned int)(nextCh - chDigit_0);
        else if ((nextCh >= chLatin_A) && (nextCh <= chLatin_F))
            nextVal= (unsigned int)(10 + (nextCh - chLatin_A));
        else if ((nextCh >= chLatin_a) && (nextCh <= chLatin_f))
            nextVal = (unsigned int)(10 + (nextCh - chLatin_a));
        else
        {
            //
            //  If we got at least a sigit, then do an unterminated ref
            //  error. Else, do an expected a numerical ref thing.
            //
            if (gotOne)
                fScanner->emitError(XMLErrs::UnterminatedCharRef);
            else
                fScanner->emitError(XMLErrs::ExpectedNumericalCharRef);

            return false;
        }

        //
        //  Make sure its valid for the radix. If not, then just eat the
        //  digit and go on after issueing an error. Else, update the
        //  running value with this new digit.
        //
        if (nextVal >= radix)
        {
            XMLCh tmpStr[2];
            tmpStr[0] = nextCh;
            tmpStr[1] = chNull;
            fScanner->emitError(XMLErrs::BadDigitForRadix, tmpStr);
        }
         else
        {
            value = (value * radix) + nextVal;
        }

        // Indicate that we got at least one good digit
        gotOne = true;

        // Eat the char we just processed
        fReaderMgr->getNextChar();
    }

    // Return the char (or chars)
    // And check if the character expanded is valid or not
    if (value >= 0x10000 && value <= 0x10FFFF)
    {
        value -= 0x10000;
        first  = XMLCh((value >> 10) + 0xD800);
        second = XMLCh((value & 0x3FF) + 0xDC00);
    }
    else if (value <= 0xFFFD)
    {
        first  = XMLCh(value);
        second = 0;
        if (!fReaderMgr->getCurrentReader()->isXMLChar(first) && !fReaderMgr->getCurrentReader()->isControlChar(first)) {
            // Character reference was not in the valid range
            fScanner->emitError(XMLErrs::InvalidCharacterRef);
            return false;
        }
    }
    else {
        // Character reference was not in the valid range
        fScanner->emitError(XMLErrs::InvalidCharacterRef);
        return false;
    }

    return true;
}